

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_analyze.hpp
# Opt level: O1

idx_t duckdb::PatasFinalAnalyze<float>(AnalyzeState *state)

{
  InternalException *this;
  string local_40;
  
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Patas has been deprecated, can no longer be used to compress data"
             ,"");
  InternalException::InternalException(this,&local_40);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t PatasFinalAnalyze(AnalyzeState &state) {
	throw InternalException("Patas has been deprecated, can no longer be used to compress data");
}